

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-condvar.c
# Opt level: O0

int condvar_wait(worker_config_conflict *c,int *flag)

{
  int64_t eval_b;
  int64_t eval_a;
  int *flag_local;
  worker_config_conflict *c_local;
  
  uv_mutex_lock(&c->mutex);
  uv_sem_post(&c->sem_waiting);
  do {
    uv_cond_wait(&c->cond,&c->mutex);
  } while (*flag == 0);
  if ((long)*flag != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-condvar.c"
            ,0x74,"1","==","*flag",1,"==",(long)*flag);
    abort();
  }
  uv_mutex_unlock(&c->mutex);
  uv_sem_wait(&c->sem_signaled);
  return 0;
}

Assistant:

static int condvar_wait(worker_config* c, const int* flag) {
  uv_mutex_lock(&c->mutex);

  /* Tell signal'er that I am waiting. */
  uv_sem_post(&c->sem_waiting);

  /* Wait until I get a non-spurious signal. */
  do {
    uv_cond_wait(&c->cond, &c->mutex);
  } while (*flag == 0);
  ASSERT_EQ(1, *flag);

  uv_mutex_unlock(&c->mutex);

  /* Wait for my signal'er to finish. */
  uv_sem_wait(&c->sem_signaled);

  return 0;
}